

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O2

Txid * __thiscall
cfd::core::MerkleBlock::CalculateHash
          (Txid *__return_storage_ptr__,MerkleBlock *this,uint64_t height,uint64_t pos,
          vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *txids)

{
  uint64_t height_00;
  ulong pos_00;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_b8;
  ByteData data;
  Txid right;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  Txid left;
  
  if (height == 0) {
    Txid::Txid(__return_storage_ptr__,
               (txids->super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>).
               _M_impl.super__Vector_impl_data._M_start + pos);
  }
  else {
    height_00 = height - 1;
    CalculateHash(&left,this,height_00,pos * 2,txids);
    Txid::Txid(&right);
    pos_00 = pos * 2 | 1;
    if (pos_00 < ~(-1L << ((byte)height_00 & 0x3f)) + this->transaction_count >>
                 ((byte)height_00 & 0x3f)) {
      CalculateHash((Txid *)&data,this,height_00,pos_00,txids);
      Txid::operator=(&right,(Txid *)&data);
      Txid::~Txid((Txid *)&data);
    }
    else {
      Txid::operator=(&right,&left);
    }
    Txid::GetData((ByteData *)&_Stack_b8,&left);
    Txid::GetData((ByteData *)&local_60,&right);
    ByteData::Concat<cfd::core::ByteData>(&data,(ByteData *)&_Stack_b8,(ByteData *)&local_60);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_b8);
    HashUtil::Sha256D((ByteData256 *)&_Stack_b8,&data);
    Txid::Txid(__return_storage_ptr__,(ByteData256 *)&_Stack_b8);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_b8);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    Txid::~Txid(&right);
    Txid::~Txid(&left);
  }
  return __return_storage_ptr__;
}

Assistant:

Txid MerkleBlock::CalculateHash(
    uint64_t height, uint64_t pos, const std::vector<Txid>& txids) {
  if (height == 0) return txids[pos];

  Txid left = CalculateHash(height - 1, pos * 2, txids);
  Txid right;
  if ((pos * 2 + 1) < CalcTreeWidth(transaction_count, height - 1)) {
    right = CalculateHash(height - 1, pos * 2 + 1, txids);
  } else {
    right = left;
  }
  ByteData data = left.GetData().Concat(right.GetData());
  return Txid(HashUtil::Sha256D(data));
}